

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar2;
  pointer pBVar3;
  ulong uVar4;
  Net *pNVar5;
  int iVar6;
  int iVar7;
  Layer *pLVar8;
  long lVar9;
  int *piVar10;
  char *pcVar11;
  int j;
  long lVar12;
  long lVar13;
  size_t sStack_ce0;
  allocator local_cd1;
  int top_count;
  int bottom_count;
  int local_cc8;
  int blob_count;
  ulong local_cc0;
  Layer *local_cb8;
  int layer_count;
  Net *local_ca8;
  DataReader *local_ca0;
  Mat local_c98;
  int magic;
  vector<int,_std::allocator<int>_> *local_c48;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c40;
  Mat shape_hints;
  char layer_type [256];
  char layer_name [256];
  ParamDict pd;
  
  magic = 0;
  local_ca8 = this;
  iVar6 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar6 == 1) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar6 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar6 == 1) {
        iVar6 = (*dr->_vptr_DataReader[2])(dr,"%d",&blob_count);
        pNVar5 = local_ca8;
        if (iVar6 == 1) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            local_c40 = &local_ca8->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_c40,(long)layer_count);
            this_00 = &pNVar5->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)blob_count);
            ParamDict::ParamDict(&pd);
            local_cc8 = 0;
            local_cc0 = 0;
            local_ca0 = dr;
            do {
              if (layer_count <= local_cc8) {
                iVar6 = 0;
LAB_0012e0aa:
                ParamDict::~ParamDict(&pd);
                return iVar6;
              }
              bottom_count = 0;
              top_count = 0;
              iVar6 = (*dr->_vptr_DataReader[2])(dr,"%255s",layer_type);
              if (iVar6 != 1) {
                pcVar11 = "parse layer_type failed";
LAB_0012e16f:
                sStack_ce0 = 0x17;
LAB_0012e08f:
                fwrite(pcVar11,sStack_ce0,1,_stderr);
                fputc(10,_stderr);
LAB_0012e0a3:
                iVar6 = -1;
                goto LAB_0012e0aa;
              }
              iVar6 = (*dr->_vptr_DataReader[2])(dr,"%255s",layer_name);
              if (iVar6 != 1) {
                pcVar11 = "parse layer_name failed";
                goto LAB_0012e16f;
              }
              iVar6 = (*dr->_vptr_DataReader[2])(dr,"%d",&bottom_count);
              if (iVar6 != 1) {
                pcVar11 = "parse bottom_count failed";
                sStack_ce0 = 0x19;
                goto LAB_0012e08f;
              }
              iVar6 = (*dr->_vptr_DataReader[2])(dr,"%d",&top_count);
              if (iVar6 != 1) {
                pcVar11 = "parse top_count failed";
LAB_0012e08d:
                sStack_ce0 = 0x16;
                goto LAB_0012e08f;
              }
              pLVar8 = create_layer(layer_type);
              if ((pLVar8 == (Layer *)0x0) &&
                 (pLVar8 = create_custom_layer(local_ca8,layer_type), pLVar8 == (Layer *)0x0)) {
                fprintf(_stderr,"layer %s not exists or registered",layer_type);
                fputc(10,_stderr);
                clear(local_ca8);
                goto LAB_0012e0a3;
              }
              std::__cxx11::string::string
                        ((string *)&shape_hints,layer_type,(allocator *)&local_c98);
              std::__cxx11::string::operator=((string *)&pLVar8->type,(string *)&shape_hints);
              std::__cxx11::string::~string((string *)&shape_hints);
              std::__cxx11::string::string
                        ((string *)&shape_hints,layer_name,(allocator *)&local_c98);
              std::__cxx11::string::operator=((string *)&pLVar8->name,(string *)&shape_hints);
              std::__cxx11::string::~string((string *)&shape_hints);
              local_c48 = &pLVar8->bottoms;
              std::vector<int,_std::allocator<int>_>::resize(local_c48,(long)bottom_count);
              pvVar1 = local_c48;
              lVar13 = 0;
              local_cb8 = pLVar8;
              while( true ) {
                uVar4 = local_cc0;
                iVar6 = (int)local_cc0;
                lVar9 = (long)(int)local_cc0;
                if (bottom_count <= lVar13) break;
                iVar7 = (*local_ca0->_vptr_DataReader[2])(local_ca0,"%255s",&shape_hints);
                if (iVar7 != 1) {
                  pcVar11 = "parse bottom_name failed";
                  sStack_ce0 = 0x18;
                  goto LAB_0012e08f;
                }
                iVar7 = find_blob_index_by_name(local_ca8,(char *)&shape_hints);
                if (iVar7 == -1) {
                  pBVar3 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  std::__cxx11::string::string((string *)&local_c98,(char *)&shape_hints,&local_cd1)
                  ;
                  std::__cxx11::string::operator=((string *)(pBVar3 + lVar9),(string *)&local_c98);
                  std::__cxx11::string::~string((string *)&local_c98);
                  iVar7 = (int)local_cc0;
                  local_cc0 = (ulong)(iVar6 + 1);
                }
                else {
                  lVar9 = (long)iVar7;
                }
                std::vector<int,_std::allocator<int>_>::push_back
                          (&(this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                            _M_impl.super__Vector_impl_data._M_start[lVar9].consumers,&local_cc8);
                (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar13] = iVar7;
                lVar13 = lVar13 + 1;
              }
              pvVar1 = &local_cb8->tops;
              std::vector<int,_std::allocator<int>_>::resize(pvVar1,(long)top_count);
              local_cc0 = uVar4 & 0xffffffff;
              lVar9 = lVar9 << 7;
              for (lVar13 = 0; dr = local_ca0, lVar13 < top_count; lVar13 = lVar13 + 1) {
                pBVar3 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                iVar6 = (*local_ca0->_vptr_DataReader[2])(local_ca0,"%255s",&shape_hints);
                if (iVar6 != 1) {
                  pcVar11 = "parse blob_name failed";
                  goto LAB_0012e08d;
                }
                std::__cxx11::string::string((string *)&local_c98,(char *)&shape_hints,&local_cd1);
                std::__cxx11::string::operator=
                          ((string *)((long)&(pBVar3->name)._M_dataplus._M_p + lVar9),
                           (string *)&local_c98);
                std::__cxx11::string::~string((string *)&local_c98);
                *(int *)((long)&pBVar3->producer + lVar9) = local_cc8;
                (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar13] = (int)local_cc0 + (int)lVar13;
                lVar9 = lVar9 + 0x80;
              }
              iVar6 = ParamDict::load_param(&pd,local_ca0);
              if (iVar6 == 0) {
                local_c98.elemsize._0_4_ = 0;
                local_c98.elemsize._4_4_ = 0;
                local_c98.elempack = 0;
                local_c98.data = (void *)0x0;
                local_c98.refcount._0_4_ = 0;
                local_c98.refcount._4_4_ = 0;
                local_c98.h = 0;
                local_c98.c = 0;
                local_c98.cstep = 0;
                local_c98.allocator = (Allocator *)0x0;
                local_c98.dims = 0;
                local_c98.w = 0;
                ParamDict::get(&shape_hints,&pd,0x1e,&local_c98);
                Mat::~Mat(&local_c98);
                if ((shape_hints.data != (void *)0x0) &&
                   ((long)shape_hints.c * shape_hints.cstep != 0)) {
                  piVar10 = (int *)((long)shape_hints.data + 8);
                  for (lVar9 = 0; lVar9 < top_count; lVar9 = lVar9 + 1) {
                    iVar6 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar9];
                    pBVar3 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    iVar7 = piVar10[-2];
                    if (iVar7 == 3) {
                      local_c98.h = piVar10[0];
                      local_c98.c = piVar10[1];
                      local_c98.data = (void *)0x0;
                      local_c98.refcount._0_4_ = 0;
                      local_c98.refcount._4_4_ = 0;
                      local_c98.elemsize._0_4_ = 4;
                      local_c98.elemsize._4_4_ = 0;
                      local_c98.elempack = 1;
                      local_c98.allocator = (Allocator *)0x0;
                      local_c98.w = piVar10[-1];
                      local_c98.dims = 3;
                      local_c98.cstep = (long)(local_c98.h * piVar10[-1]) + 3U & 0x3ffffffffffffffc;
                      Mat::operator=(&pBVar3[iVar6].shape,&local_c98);
LAB_0012ded6:
                      Mat::~Mat(&local_c98);
                    }
                    else {
                      if (iVar7 == 2) {
                        local_c98.data = (void *)0x0;
                        local_c98.refcount._0_4_ = 0;
                        local_c98.refcount._4_4_ = 0;
                        local_c98.elemsize._0_4_ = 4;
                        local_c98.elemsize._4_4_ = 0;
                        local_c98.elempack = 1;
                        local_c98.allocator = (Allocator *)0x0;
                        local_c98.w = piVar10[-1];
                        local_c98.dims = 2;
                        local_c98.c = 1;
                        local_c98.h = *piVar10;
                        local_c98.cstep = (size_t)(*piVar10 * piVar10[-1]);
                        Mat::operator=(&pBVar3[iVar6].shape,&local_c98);
                        goto LAB_0012ded6;
                      }
                      if (iVar7 == 1) {
                        local_c98.cstep = (size_t)piVar10[-1];
                        local_c98.data = (void *)0x0;
                        local_c98.refcount._0_4_ = 0;
                        local_c98.refcount._4_4_ = 0;
                        local_c98.elemsize._0_4_ = 4;
                        local_c98.elemsize._4_4_ = 0;
                        local_c98.elempack = 1;
                        local_c98.allocator = (Allocator *)0x0;
                        local_c98.w = piVar10[-1];
                        local_c98.dims = 1;
                        local_c98.h = 1;
                        local_c98.c = 1;
                        Mat::operator=(&pBVar3[iVar6].shape,&local_c98);
                        goto LAB_0012ded6;
                      }
                    }
                    piVar10 = piVar10 + 4;
                  }
                }
                pvVar2 = &local_cb8->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (pvVar2,(long)bottom_count);
                lVar9 = 0;
                for (lVar12 = 0; lVar12 < bottom_count; lVar12 = lVar12 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar2->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar9),
                                 &(this_00->
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(local_c48->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[lVar12]].shape);
                  lVar9 = lVar9 + 0x40;
                }
                pvVar2 = &local_cb8->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar2,(long)top_count);
                lVar9 = 0;
                for (lVar12 = 0; lVar12 < top_count; lVar12 = lVar12 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar2->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar9),
                                 &(this_00->
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[lVar12]].shape);
                  lVar9 = lVar9 + 0x40;
                }
                iVar6 = (*local_cb8->_vptr_Layer[2])(local_cb8,&pd);
                dr = local_ca0;
                if (iVar6 == 0) {
                  (local_c40->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[local_cc8] = local_cb8;
                }
                else {
                  fwrite("layer load_param failed",0x17,1,_stderr);
                  fputc(10,_stderr);
                }
                Mat::~Mat(&shape_hints);
              }
              else {
                fwrite("ParamDict load_param failed",0x1b,1,_stderr);
                fputc(10,_stderr);
              }
              local_cc0 = local_cc0 + lVar13;
              local_cc8 = local_cc8 + 1;
            } while( true );
          }
          pcVar11 = "invalid layer_count or blob_count";
          sStack_ce0 = 0x21;
        }
        else {
          pcVar11 = "parse blob_count failed";
          sStack_ce0 = 0x17;
        }
      }
      else {
        pcVar11 = "parse layer_count failed";
        sStack_ce0 = 0x18;
      }
    }
    else {
      pcVar11 = "param is too old, please regenerate";
      sStack_ce0 = 0x23;
    }
  }
  else {
    pcVar11 = "parse magic failed";
    sStack_ce0 = 0x12;
  }
  fwrite(pcVar11,sStack_ce0,1,_stderr);
  fputc(10,_stderr);
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v) \
    if (dr.scan(fmt, &v) != 1) \
    { \
        NCNN_LOGE("parse " #v " failed"); \
        return -1; \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    layers.resize((size_t)layer_count);
    blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;

#if __APPLE__
        opt.use_image_storage = false;
#endif
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i=0; i<layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
//         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j=0; j<bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
//                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            Blob& blob = blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
//             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param failed");
            continue;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param failed");
            continue;
        }

        layers[i] = layer;
    }

#undef SCAN_VALUE
    return 0;
}